

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffm_score_test.cc
# Opt level: O2

void __thiscall
xLearn::FFMScore_Test_calc_score_overflow_Test::TestBody
          (FFMScore_Test_calc_score_overflow_Test *this)

{
  uint uVar1;
  index_t iVar2;
  real_t *prVar3;
  index_t i;
  int iVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  index_t j;
  index_t iVar8;
  char *message;
  index_t f;
  index_t iVar9;
  uint uVar10;
  bool bVar11;
  real_t expected;
  undefined1 auVar12 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 extraout_var [56];
  AssertionResult gtest_ar;
  AssertHelper local_358;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_350;
  SparseRow row;
  Model model;
  FFMScore score;
  HyperParam local_240;
  undefined1 auVar13 [64];
  
  for (iVar2 = 1; iVar2 != 100; iVar2 = iVar2 + 1) {
    HyperParam::HyperParam(&local_240);
    local_240._148_8_ = vmovlps_avx(SUB6416(ZEXT464(0x3dcccccd),0));
    std::__cxx11::string::assign((char *)&local_240.loss_func);
    std::__cxx11::string::assign((char *)&local_240.score_func);
    auVar13._8_56_ = extraout_var;
    auVar13._0_8_ = extraout_XMM1_Qa;
    auVar12 = auVar13._0_16_;
    local_240.num_feature = 3;
    local_240.num_K = iVar2;
    local_240.num_field = local_240.num_feature;
    std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::vector
              (&row,6,(allocator_type *)&model);
    prVar3 = &(row.super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>._M_impl.
               super__Vector_impl_data._M_start)->feat_val;
    for (uVar7 = 0; local_240.num_feature * 2 != uVar7; uVar7 = uVar7 + 1) {
      prVar3[-1] = (real_t)(index_t)uVar7;
      *prVar3 = 2.0;
      ((Node *)(prVar3 + -2))->field_id = (index_t)uVar7;
      prVar3 = prVar3 + 3;
    }
    model.score_func_._M_dataplus._M_p = (pointer)&model.score_func_.field_2;
    model.loss_func_._M_dataplus._M_p = (pointer)&model.loss_func_.field_2;
    model.score_func_._M_string_length = 0;
    model.score_func_.field_2._M_local_buf[0] = '\0';
    model.loss_func_._M_string_length = 0;
    model.loss_func_.field_2._M_local_buf[0] = '\0';
    model.param_best_v_ = (real_t *)0x0;
    model.param_best_b_ = (real_t *)0x0;
    model.param_w_ = (real_t *)0x0;
    model.param_v_ = (real_t *)0x0;
    model.param_b_ = (real_t *)0x0;
    model.param_best_w_ = (real_t *)0x0;
    Model::Initialize(&model,&local_240.score_func,&local_240.loss_func,local_240.num_feature,
                      local_240.num_field,local_240.num_K,2,1.0);
    for (uVar7 = 0; model.param_num_w_ != uVar7; uVar7 = uVar7 + 1) {
      model.param_w_[uVar7] = 1.0;
    }
    iVar8 = 0;
    auVar12 = vcvtusi2ss_avx512f(auVar12,model.num_K_);
    auVar12 = ZEXT416((uint)(auVar12._0_4_ * 0.25));
    auVar12 = vroundss_avx(auVar12,auVar12,10);
    iVar4 = vcvttss2usi_avx512f(auVar12);
    prVar3 = model.param_v_;
    for (; iVar8 != model.num_feat_; iVar8 = iVar8 + 1) {
      for (iVar9 = 0; iVar9 != model.num_field_; iVar9 = iVar9 + 1) {
        uVar1 = 0;
        while (uVar10 = uVar1, uVar10 < (uint)(iVar4 << 2)) {
          prVar3 = prVar3 + 4;
          for (iVar5 = 0; uVar1 = uVar10 + 4, iVar5 != 4; iVar5 = iVar5 + 1) {
            prVar3[-4] = (real_t)((uint)(uVar10 + iVar5 < model.num_K_) * 0x3f800000);
            *prVar3 = 1.0;
            prVar3 = prVar3 + 1;
          }
        }
      }
    }
    score.super_Score.opt_type_._M_dataplus._M_p = (pointer)&score.super_Score.opt_type_.field_2;
    *model.param_b_ = 0.0;
    score.super_Score.opt_type_._M_string_length = 0;
    score.super_Score.opt_type_.field_2._M_local_buf[0] = '\0';
    score.super_Score._vptr_Score = (_func_int **)&PTR__Score_00149458;
    score.comp_res1 = (real_t *)0x0;
    score.comp_res2 = (real_t *)0x0;
    score.comp_z_lt_zero = (real_t *)0x0;
    score.comp_z_gt_zero = (real_t *)0x0;
    lVar6 = 10;
    while (bVar11 = lVar6 != 0, lVar6 = lVar6 + -1, bVar11) {
      expected = FFMScore::CalcScore(&score,&row,&model,1.0);
      testing::internal::CmpHelperFloatingPointEQ<float>
                ((internal *)&gtest_ar,"val","6+k*4*3",expected,(float)(int)(iVar2 * 0xc + 6));
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_350);
        message = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_358,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/score/ffm_score_test.cc"
                   ,0x83,message);
        testing::internal::AssertHelper::operator=(&local_358,(Message *)&local_350);
        testing::internal::AssertHelper::~AssertHelper(&local_358);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_350);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
    }
    Score::~Score(&score.super_Score);
    Model::~Model(&model);
    std::_Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>::~_Vector_base
              (&row.super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>);
    HyperParam::~HyperParam(&local_240);
  }
  return;
}

Assistant:

TEST(FFMScore_Test, calc_score_overflow) {
  for (index_t k = 1; k < 100; ++k) {
    // Init hyper_param
    HyperParam param;
    param.learning_rate = 0.1;
    param.regu_lambda = 0;
    param.loss_func = "squared";
    param.score_func = "ffm";
    param.num_feature = 3;
    param.num_K = k;
    param.num_field = 3;
    // Init SparseRow
    SparseRow row(param.num_feature*2);
    for (index_t i = 0; i < param.num_feature*2; ++i) {
      row[i].feat_id = i;
      row[i].feat_val = 2.0;
      row[i].field_id = i;
    }
    // Init model
    Model model;
    model.Initialize(param.score_func,
                param.loss_func,
                param.num_feature,
                param.num_field,
                param.num_K, 2);
    real_t* w = model.GetParameter_w();
    index_t num_w = model.GetNumParameter_w();
    for (index_t i = 0; i < num_w; ++i) {
      w[i] = 1.0;
    }
    real_t* v = model.GetParameter_v();
    index_t k_aligned = model.get_aligned_k();
    for (index_t j = 0; j < model.GetNumFeature(); ++j) {
      for (index_t f = 0; f < model.GetNumField(); ++f) {
        for (index_t d = 0; d < k_aligned; ) {
          for (index_t s = 0; s < kAlign; s++, v++, d++) {
            v[0] = (d < model.GetNumK()) ? 1.0 : 0.0;
            v[kAlign] = 1.0;
          }
          v += kAlign;
        }
      }
    }
    model.GetParameter_b()[0] = 0.0;
    FFMScore score;
    for (size_t i = 0; i < 10; ++i) {
      real_t val = score.CalcScore(&row, model);
      EXPECT_FLOAT_EQ(val, 6+k*4*3);
    }
  }
}